

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::CaptureDynamicProfileState
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  BYTE BVar1;
  ImplicitCallFlags IVar2;
  uint32 state;
  NativeEntryPointData *pNVar3;
  FunctionEntryPointInfo *entryPointInfo_local;
  FunctionBody *this_local;
  
  pNVar3 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  state = NativeEntryPointData::GetPendingPolymorphicCacheState(pNVar3);
  SetSavedPolymorphicCacheState(this,state);
  pNVar3 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  BVar1 = NativeEntryPointData::GetPendingInlinerVersion(pNVar3);
  this->savedInlinerVersion = BVar1;
  pNVar3 = EntryPointInfo::GetNativeEntryPointData(&entryPointInfo->super_EntryPointInfo);
  IVar2 = NativeEntryPointData::GetPendingImplicitCallFlags(pNVar3);
  this->savedImplicitCallsFlags = IVar2;
  return;
}

Assistant:

void FunctionBody::CaptureDynamicProfileState(FunctionEntryPointInfo* entryPointInfo)
    {
        // DisableJIT-TODO: Move this to be under if DYNAMIC_PROFILE
#if ENABLE_NATIVE_CODEGEN
        // (See also the FunctionBody member written in CaptureDynamicProfileState.)
        this->SetSavedPolymorphicCacheState(entryPointInfo->GetNativeEntryPointData()->GetPendingPolymorphicCacheState());
        this->savedInlinerVersion = entryPointInfo->GetNativeEntryPointData()->GetPendingInlinerVersion();
        this->savedImplicitCallsFlags = entryPointInfo->GetNativeEntryPointData()->GetPendingImplicitCallFlags();
#endif
    }